

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-eintr-handling.c
# Opt level: O0

int run_test_eintr_handling(void)

{
  int iVar1;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 local_b8 [4];
  int nread;
  uv_signal_t signal;
  uv_thread_t thread;
  thread_ctx ctx;
  
  iov = (uv_buf_t)uv_buf_init(buf,0x20);
  loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_signal_init(loop,local_b8);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-eintr-handling.c"
            ,0x49,"uv_signal_init(loop, &signal)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_signal_start(local_b8,sig_func,10);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-eintr-handling.c"
            ,0x4a,"uv_signal_start(&signal, sig_func, 10)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = pipe(pipe_fds);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-eintr-handling.c"
            ,0x4c,"pipe(pipe_fds)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_thread_create(&signal.caught_signals,thread_main,&thread);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-eintr-handling.c"
            ,0x4d,"uv_thread_create(&thread, thread_main, &ctx)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_fs_read(loop,&read_req,pipe_fds[0],&iov,1,0xffffffffffffffff,0);
  if ((long)iVar1 != 0xd) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-eintr-handling.c"
            ,0x51,"nread","==","sizeof(test_buf)",(long)iVar1,"==",0xd);
    abort();
  }
  iVar1 = strcmp(buf,test_buf);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-eintr-handling.c"
            ,0x52,"strcmp(buf, test_buf)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_run(loop,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-eintr-handling.c"
            ,0x54,"uv_run(loop, UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = close(pipe_fds[0]);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-eintr-handling.c"
            ,0x56,"close(pipe_fds[0])","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = close(pipe_fds[1]);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-eintr-handling.c"
            ,0x57,"close(pipe_fds[1])","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_close(local_b8,0);
  iVar1 = uv_thread_join(&signal.caught_signals);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-eintr-handling.c"
            ,0x5a,"uv_thread_join(&thread)","==","0",(long)iVar1,"==",0);
    abort();
  }
  close_loop(loop);
  iVar1 = uv_loop_close(loop);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-eintr-handling.c"
            ,0x5c,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(eintr_handling) {
  struct thread_ctx ctx;
  uv_thread_t thread;
  uv_signal_t signal;
  int nread;

  iov = uv_buf_init(buf, sizeof(buf));
  loop = uv_default_loop();

  ASSERT_OK(uv_signal_init(loop, &signal));
  ASSERT_OK(uv_signal_start(&signal, sig_func, SIGUSR1));

  ASSERT_OK(pipe(pipe_fds));
  ASSERT_OK(uv_thread_create(&thread, thread_main, &ctx));

  nread = uv_fs_read(loop, &read_req, pipe_fds[0], &iov, 1, -1, NULL);

  ASSERT_EQ(nread, sizeof(test_buf));
  ASSERT_OK(strcmp(buf, test_buf));

  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));

  ASSERT_OK(close(pipe_fds[0]));
  ASSERT_OK(close(pipe_fds[1]));
  uv_close((uv_handle_t*) &signal, NULL);

  ASSERT_OK(uv_thread_join(&thread));

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}